

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkState.cpp
# Opt level: O0

void __thiscall xmrig::NetworkState::onActive(NetworkState *this,IClient *client)

{
  uint16_t uVar1;
  String *pSVar2;
  uint64_t uVar3;
  long *in_RSI;
  char *in_RDI;
  String *in_stack_ffffffffffffffd8;
  
  (**(code **)(*in_RSI + 0x50))();
  pSVar2 = Pool::host((Pool *)0x237b8b);
  pSVar2 = (String *)String::data(pSVar2);
  (**(code **)(*in_RSI + 0x50))();
  uVar1 = Pool::port((Pool *)0x237bab);
  snprintf(in_RDI,0xff,"%s:%d",pSVar2,(ulong)uVar1);
  (**(code **)(*in_RSI + 0x58))();
  String::operator=(pSVar2,in_stack_ffffffffffffffd8);
  (**(code **)(*in_RSI + 0x40))();
  String::operator=(pSVar2,(char *)in_stack_ffffffffffffffd8);
  (**(code **)(*in_RSI + 0x38))();
  String::operator=(pSVar2,(char *)in_stack_ffffffffffffffd8);
  in_RDI[0x178] = '\x01';
  uVar3 = Chrono::steadyMSecs();
  *(uint64_t *)(in_RDI + 0x1c8) = uVar3;
  return;
}

Assistant:

void xmrig::NetworkState::onActive(IClient *client)
{
    snprintf(pool, sizeof(pool) - 1, "%s:%d", client->pool().host().data(), client->pool().port());

    m_ip             = client->ip();
    m_tls            = client->tlsVersion();
    m_fingerprint    = client->tlsFingerprint();
    m_active         = true;
    m_connectionTime = Chrono::steadyMSecs();
}